

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Threads.cpp
# Opt level: O3

PSNodeFork * __thiscall
dg::pta::LLVMPointerGraphBuilder::createForkNode
          (LLVMPointerGraphBuilder *this,CallInst *CInst,PSNode *callNode)

{
  iterator __position;
  PSNodeFork *pPVar1;
  iterator iVar2;
  PSNodeFork *forkNode;
  PSNodeFork *local_28;
  PSNode *local_20;
  
  local_20 = getOperand(this,*(Value **)
                              (CInst + (0x40 - (ulong)(uint)(*(int *)(CInst + 0x14) << 5))));
  pPVar1 = (PSNodeFork *)
           PointerGraph::create<(dg::pta::PSNodeType)13,dg::pta::PSNode*>
                     ((PointerGraph *)this,&local_20);
  local_28 = (PSNodeFork *)0x0;
  if ((pPVar1->super_PSNode).type == FORK) {
    local_28 = pPVar1;
  }
  callNode->pairedNode = &local_28->super_PSNode;
  (local_28->super_PSNode).pairedNode = callNode;
  local_28->callInstruction = callNode;
  __position._M_current = *(PSNodeFork ***)(this + 0x200);
  if (__position._M_current == *(PSNodeFork ***)(this + 0x208)) {
    std::vector<dg::pta::PSNodeFork*,std::allocator<dg::pta::PSNodeFork*>>::
    _M_realloc_insert<dg::pta::PSNodeFork*const&>
              ((vector<dg::pta::PSNodeFork*,std::allocator<dg::pta::PSNodeFork*>> *)(this + 0x1f8),
               __position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    *(long *)(this + 0x200) = *(long *)(this + 0x200) + 8;
  }
  addArgumentOperands(this,CInst,callNode);
  local_20 = (PSNode *)llvm::Value::stripPointerCasts();
  if ((local_20 != (PSNode *)0x0) &&
     (*(char *)&(local_20->super_SubgraphNode<dg::pta::PSNode>).data == '\0')) {
    iVar2 = std::
            _Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(this + 0x188),(key_type *)&local_20);
    addFunctionToFork(this,(PSNode *)
                           **(undefined8 **)
                             ((long)iVar2.
                                    super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                                    ._M_cur + 0x10),local_28);
  }
  return local_28;
}

Assistant:

PSNodeFork *LLVMPointerGraphBuilder::createForkNode(const llvm::CallInst *CInst,
                                                    PSNode *callNode) {
    using namespace llvm;
    PSNodeFork *forkNode = PSNodeFork::get(
            PS.create<PSNodeType::FORK>(getOperand(CInst->getArgOperand(2))));
    callNode->setPairedNode(forkNode);
    forkNode->setPairedNode(callNode);

    forkNode->setCallInst(callNode);

    forkNodes.push_back(forkNode);
    addArgumentOperands(*CInst, *callNode);

    const Value *spawnedFunc = CInst->getArgOperand(2)->stripPointerCasts();
    if (const Function *func = dyn_cast<Function>(spawnedFunc)) {
        addFunctionToFork(getNodes(func)->getSingleNode(), forkNode);
    }

    return forkNode;
}